

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O2

void cppcms::impl::details::decimal_traits<true>::conv<int>(int v,char **begin,char **buf)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = (ulong)(uint)v;
  if (-1 < v) {
    decimal_traits<false>::conv<int>(v,begin,buf);
    return;
  }
  pcVar1 = *buf;
  *buf = pcVar1 + 1;
  *pcVar1 = '-';
  *begin = *buf;
  while (iVar3 = (int)uVar2, iVar3 != 0) {
    pcVar1 = *buf;
    *buf = pcVar1 + 1;
    *pcVar1 = '0' - (char)(iVar3 % 10);
    uVar2 = (long)iVar3 / 10;
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}